

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t lha_read_file_extended_header
                  (archive_read *a,lha *lha,uint16_t *crc,wchar_t sizefield_length,size_t limitsize,
                  size_t *total_size)

{
  archive_string *as;
  byte bVar1;
  uint16_t uVar2;
  uchar *p;
  uint *pp;
  void *pp_00;
  archive_string_conv *paVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  uchar *p_1;
  ulong *_p;
  size_t min;
  archive_string *as_00;
  ulong min_00;
  ulong uVar9;
  archive_string local_48;
  ulong len;
  
  min_00 = (ulong)(uint)sizefield_length;
  *total_size = min_00;
  pp = (uint *)__archive_read_ahead(a,min_00,(ssize_t *)0x0);
  if (pp != (uint *)0x0) {
    uVar5 = sizefield_length + L'\x01';
    len = (ulong)uVar5;
    as = &lha->dirname;
    do {
      if (sizefield_length == L'\x02') {
        min = (size_t)(ushort)*pp;
      }
      else {
        min = (size_t)*pp;
      }
      if (min == 0) {
        if (crc != (uint16_t *)0x0) {
          uVar2 = lha_crc16(*crc,pp,min_00);
          *crc = uVar2;
        }
        __archive_read_consume(a,min_00);
        return L'\0';
      }
      if ((min <= min_00) || (limitsize < *total_size + min)) goto LAB_004a57fe;
      pp_00 = __archive_read_ahead(a,min,(ssize_t *)0x0);
      if (pp_00 == (void *)0x0) break;
      *total_size = *total_size + min;
      bVar1 = *(byte *)((long)pp_00 + min_00);
      if ((crc != (uint16_t *)0x0) && (bVar1 != 0)) {
        uVar2 = lha_crc16(*crc,pp_00,min);
        *crc = uVar2;
      }
      uVar9 = min - len;
      _p = (ulong *)((long)pp_00 + len);
      uVar6 = (uint)min;
      if (bVar1 < 0x40) {
        if (bVar1 == 0) {
          if ((1 < uVar9) && (lha->header_crc = (ushort)*_p, crc != (uint16_t *)0x0)) {
            uVar2 = lha_crc16(*crc,pp_00,len);
            *crc = uVar2;
            uVar2 = lha_crc16(uVar2,"",2);
            *crc = uVar2;
            uVar2 = lha_crc16(uVar2,(ushort *)((long)_p + 2),uVar9 - 2);
            *crc = uVar2;
          }
        }
        else if (bVar1 == 1) {
          if (uVar6 != uVar5) {
            if ((char)*_p != '\0') {
              (lha->filename).length = 0;
              as_00 = &lha->filename;
              goto LAB_004a56e0;
            }
            goto LAB_004a57fe;
          }
          (lha->filename).length = 0;
        }
        else if (bVar1 == 2) {
          if ((uVar6 != uVar5) && ((char)*_p != '\0')) {
            (lha->dirname).length = 0;
            archive_strncat(as,_p,uVar9);
            uVar9 = (lha->dirname).length;
            if (uVar9 == 0) {
              uVar9 = 0;
            }
            else {
              uVar6 = 1;
              uVar7 = 0;
              do {
                if (as->s[uVar7] == -1) {
                  as->s[uVar7] = '/';
                  uVar9 = (lha->dirname).length;
                }
                uVar7 = (ulong)uVar6;
                uVar6 = uVar6 + 1;
              } while (uVar7 < uVar9);
            }
            if (as->s[uVar9 - 1] == '/') goto switchD_004a52fd_caseD_43;
          }
LAB_004a57fe:
          pcVar8 = "Invalid extended LHa header";
          goto LAB_004a5805;
        }
      }
      else {
        switch(bVar1) {
        case 0x40:
          if (uVar9 == 2) {
            lha->dos_attr = (uchar)*_p;
          }
          break;
        case 0x41:
          if (uVar9 == 0x18) {
            if (*_p < 0x19db1ded53e8000) {
              lVar4 = 0;
              uVar9 = 0;
            }
            else {
              uVar7 = *_p + 0xfe624e212ac18000;
              uVar9 = uVar7 / 10000000;
              lVar4 = (uVar7 % 10000000) * 100;
            }
            lha->birthtime_tv_nsec = lVar4;
            lha->birthtime = uVar9;
            if (_p[1] < 0x19db1ded53e8000) {
              lVar4 = 0;
              uVar9 = 0;
            }
            else {
              uVar7 = _p[1] + 0xfe624e212ac18000;
              uVar9 = uVar7 / 10000000;
              lVar4 = (uVar7 % 10000000) * 100;
            }
            lha->mtime_tv_nsec = lVar4;
            lha->mtime = uVar9;
            if (_p[2] < 0x19db1ded53e8000) {
              lVar4 = 0;
              uVar9 = 0;
            }
            else {
              uVar7 = _p[2] + 0xfe624e212ac18000;
              uVar9 = uVar7 / 10000000;
              lVar4 = (uVar7 % 10000000) * 100;
            }
            lha->atime_tv_nsec = lVar4;
            lha->atime = uVar9;
            *(byte *)&lha->setflag = (byte)lha->setflag | 3;
          }
          break;
        case 0x42:
          if (uVar9 == 0x10) {
            lha->compsize = *_p;
            lha->origsize = _p[1];
          }
          break;
        case 0x43:
        case 0x44:
        case 0x45:
        case 0x47:
        case 0x48:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4c:
        case 0x4d:
        case 0x4e:
        case 0x4f:
          break;
        case 0x46:
          if (uVar9 == 4) {
            local_48.s = (char *)0x0;
            local_48.length = 0;
            local_48.buffer_length = 0;
            pcVar8 = "UTF-8";
            if ((uint)*_p != 0xfde9) {
              archive_string_sprintf(&local_48,"CP%d");
              pcVar8 = local_48.s;
            }
            paVar3 = archive_string_conversion_from_charset(&a->archive,pcVar8,L'\x01');
            lha->sconv = paVar3;
            archive_string_free(&local_48);
            if (lha->sconv == (archive_string_conv *)0x0) {
              return L'\xffffffe2';
            }
          }
          break;
        case 0x50:
          if (uVar9 == 2) {
            lha->mode = (uint)(ushort)*_p;
            *(byte *)&lha->setflag = (byte)lha->setflag | 4;
          }
          break;
        case 0x51:
          if (uVar9 == 4) {
            lha->gid = (ulong)(ushort)*_p;
            lha->uid = (ulong)*(ushort *)((long)_p + 2);
          }
          break;
        case 0x52:
          if (uVar6 != uVar5) {
            (lha->gname).length = 0;
            as_00 = &lha->gname;
LAB_004a56e0:
            archive_strncat(as_00,_p,uVar9);
          }
          break;
        case 0x53:
          if (uVar6 != uVar5) {
            (lha->uname).length = 0;
            as_00 = &lha->uname;
            goto LAB_004a56e0;
          }
          break;
        case 0x54:
          if (uVar9 == 4) {
            lha->mtime = (ulong)(uint)*_p;
          }
          break;
        default:
          if (bVar1 == 0x7f) {
            if (uVar9 == 0x10) {
              lha->dos_attr = (uchar)*_p;
              lha->mode = (uint)*(ushort *)((long)_p + 2);
              lha->gid = (ulong)*(ushort *)((long)_p + 4);
              lha->uid = (ulong)*(ushort *)((long)_p + 6);
              lha->birthtime = (ulong)(uint)_p[1];
              uVar6 = *(uint *)((long)_p + 0xc);
              goto LAB_004a56b4;
            }
          }
          else if ((bVar1 == 0xff) && (uVar9 == 0x14)) {
            lha->mode = (uint)*_p;
            lha->gid = (ulong)*(uint *)((long)_p + 4);
            lha->uid = (ulong)(uint)_p[1];
            lha->birthtime = (ulong)*(uint *)((long)_p + 0xc);
            uVar6 = (uint)_p[2];
LAB_004a56b4:
            lha->atime = (ulong)uVar6;
            *(byte *)&lha->setflag = (byte)lha->setflag | 7;
          }
        }
      }
switchD_004a52fd_caseD_43:
      __archive_read_consume(a,min);
      pp = (uint *)__archive_read_ahead(a,min_00,(ssize_t *)0x0);
    } while (pp != (uint *)0x0);
  }
  pcVar8 = "Truncated LHa header";
LAB_004a5805:
  archive_set_error(&a->archive,0x54,pcVar8);
  return L'\xffffffe2';
}

Assistant:

static int
lha_read_file_extended_header(struct archive_read *a, struct lha *lha,
    uint16_t *crc, int sizefield_length, size_t limitsize, size_t *total_size)
{
	const void *h;
	const unsigned char *extdheader;
	size_t	extdsize;
	size_t	datasize;
	unsigned int i;
	unsigned char extdtype;

#define EXT_HEADER_CRC		0x00		/* Header CRC and information*/
#define EXT_FILENAME		0x01		/* Filename 		    */
#define EXT_DIRECTORY		0x02		/* Directory name	    */
#define EXT_DOS_ATTR		0x40		/* MS-DOS attribute	    */
#define EXT_TIMESTAMP		0x41		/* Windows time stamp	    */
#define EXT_FILESIZE		0x42		/* Large file size	    */
#define EXT_TIMEZONE		0x43		/* Time zone		    */
#define EXT_UTF16_FILENAME	0x44		/* UTF-16 filename 	    */
#define EXT_UTF16_DIRECTORY	0x45		/* UTF-16 directory name    */
#define EXT_CODEPAGE		0x46		/* Codepage		    */
#define EXT_UNIX_MODE		0x50		/* File permission	    */
#define EXT_UNIX_GID_UID	0x51		/* gid,uid		    */
#define EXT_UNIX_GNAME		0x52		/* Group name		    */
#define EXT_UNIX_UNAME		0x53		/* User name		    */
#define EXT_UNIX_MTIME		0x54		/* Modified time	    */
#define EXT_OS2_NEW_ATTR	0x7f		/* new attribute(OS/2 only) */
#define EXT_NEW_ATTR		0xff		/* new attribute	    */

	*total_size = sizefield_length;

	for (;;) {
		/* Read an extended header size. */
		if ((h =
		    __archive_read_ahead(a, sizefield_length, NULL)) == NULL)
			return (truncated_error(a));
		/* Check if the size is the zero indicates the end of the
		 * extended header. */
		if (sizefield_length == sizeof(uint16_t))
			extdsize = archive_le16dec(h);
		else
			extdsize = archive_le32dec(h);
		if (extdsize == 0) {
			/* End of extended header */
			if (crc != NULL)
				*crc = lha_crc16(*crc, h, sizefield_length);
			__archive_read_consume(a, sizefield_length);
			return (ARCHIVE_OK);
		}

		/* Sanity check to the extended header size. */
		if (((uint64_t)*total_size + extdsize) >
				    (uint64_t)limitsize ||
		    extdsize <= (size_t)sizefield_length)
			goto invalid;

		/* Read the extended header. */
		if ((h = __archive_read_ahead(a, extdsize, NULL)) == NULL)
			return (truncated_error(a));
		*total_size += extdsize;

		extdheader = (const unsigned char *)h;
		/* Get the extended header type. */
		extdtype = extdheader[sizefield_length];
		/* Calculate an extended data size. */
		datasize = extdsize - (1 + sizefield_length);
		/* Skip an extended header size field and type field. */
		extdheader += sizefield_length + 1;

		if (crc != NULL && extdtype != EXT_HEADER_CRC)
			*crc = lha_crc16(*crc, h, extdsize);
		switch (extdtype) {
		case EXT_HEADER_CRC:
			/* We only use a header CRC. Following data will not
			 * be used. */
			if (datasize >= 2) {
				lha->header_crc = archive_le16dec(extdheader);
				if (crc != NULL) {
					static const char zeros[2] = {0, 0};
					*crc = lha_crc16(*crc, h,
					    extdsize - datasize);
					/* CRC value itself as zero */
					*crc = lha_crc16(*crc, zeros, 2);
					*crc = lha_crc16(*crc,
					    extdheader+2, datasize - 2);
				}
			}
			break;
		case EXT_FILENAME:
			if (datasize == 0) {
				/* maybe directory header */
				archive_string_empty(&lha->filename);
				break;
			}
			if (extdheader[0] == '\0')
				goto invalid;
			archive_strncpy(&lha->filename,
			    (const char *)extdheader, datasize);
			break;
		case EXT_DIRECTORY:
			if (datasize == 0 || extdheader[0] == '\0')
				/* no directory name data. exit this case. */
				goto invalid;

			archive_strncpy(&lha->dirname,
		  	    (const char *)extdheader, datasize);
			/*
			 * Convert directory delimiter from 0xFF
			 * to '/' for local system.
	 		 */
			for (i = 0; i < lha->dirname.length; i++) {
				if ((unsigned char)lha->dirname.s[i] == 0xFF)
					lha->dirname.s[i] = '/';
			}
			/* Is last character directory separator? */
			if (lha->dirname.s[lha->dirname.length-1] != '/')
				/* invalid directory data */
				goto invalid;
			break;
		case EXT_DOS_ATTR:
			if (datasize == 2)
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
			break;
		case EXT_TIMESTAMP:
			if (datasize == (sizeof(uint64_t) * 3)) {
				lha->birthtime = lha_win_time(
				    archive_le64dec(extdheader),
				    &lha->birthtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				lha->mtime = lha_win_time(
				    archive_le64dec(extdheader),
				    &lha->mtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				lha->atime = lha_win_time(
				    archive_le64dec(extdheader),
				    &lha->atime_tv_nsec);
				lha->setflag |= BIRTHTIME_IS_SET |
				    ATIME_IS_SET;
			}
			break;
		case EXT_FILESIZE:
			if (datasize == sizeof(uint64_t) * 2) {
				lha->compsize = archive_le64dec(extdheader);
				extdheader += sizeof(uint64_t);
				lha->origsize = archive_le64dec(extdheader);
			}
			break;
		case EXT_CODEPAGE:
			/* Get an archived filename charset from codepage.
			 * This overwrites the charset specified by
			 * hdrcharset option. */
			if (datasize == sizeof(uint32_t)) {
				struct archive_string cp;
				const char *charset;

				archive_string_init(&cp);
				switch (archive_le32dec(extdheader)) {
				case 65001: /* UTF-8 */
					charset = "UTF-8";
					break;
				default:
					archive_string_sprintf(&cp, "CP%d",
					    (int)archive_le32dec(extdheader));
					charset = cp.s;
					break;
				}
				lha->sconv =
				    archive_string_conversion_from_charset(
					&(a->archive), charset, 1);
				archive_string_free(&cp);
				if (lha->sconv == NULL)
					return (ARCHIVE_FATAL);
			}
			break;
		case EXT_UNIX_MODE:
			if (datasize == sizeof(uint16_t)) {
				lha->mode = archive_le16dec(extdheader);
				lha->setflag |= UNIX_MODE_IS_SET;
			}
			break;
		case EXT_UNIX_GID_UID:
			if (datasize == (sizeof(uint16_t) * 2)) {
				lha->gid = archive_le16dec(extdheader);
				lha->uid = archive_le16dec(extdheader+2);
			}
			break;
		case EXT_UNIX_GNAME:
			if (datasize > 0)
				archive_strncpy(&lha->gname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_UNAME:
			if (datasize > 0)
				archive_strncpy(&lha->uname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_MTIME:
			if (datasize == sizeof(uint32_t))
				lha->mtime = archive_le32dec(extdheader);
			break;
		case EXT_OS2_NEW_ATTR:
			/* This extended header is OS/2 depend. */
			if (datasize == 16) {
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
				lha->mode = archive_le16dec(extdheader+2);
				lha->gid = archive_le16dec(extdheader+4);
				lha->uid = archive_le16dec(extdheader+6);
				lha->birthtime = archive_le32dec(extdheader+8);
				lha->atime = archive_le32dec(extdheader+12);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_NEW_ATTR:
			if (datasize == 20) {
				lha->mode = (mode_t)archive_le32dec(extdheader);
				lha->gid = archive_le32dec(extdheader+4);
				lha->uid = archive_le32dec(extdheader+8);
				lha->birthtime = archive_le32dec(extdheader+12);
				lha->atime = archive_le32dec(extdheader+16);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_TIMEZONE:		/* Not supported */
		case EXT_UTF16_FILENAME:	/* Not supported */
		case EXT_UTF16_DIRECTORY:	/* Not supported */
		default:
			break;
		}

		__archive_read_consume(a, extdsize);
	}
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid extended LHa header");
	return (ARCHIVE_FATAL);
}